

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void swapBytes(uchar *var,int size)

{
  uchar uVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)size;
  for (lVar3 = 0; lVar2 = lVar2 + -1, lVar3 < lVar2; lVar3 = lVar3 + 1) {
    uVar1 = var[lVar3];
    var[lVar3] = var[lVar2];
    var[lVar2] = uVar1;
  }
  return;
}

Assistant:

void swapBytes(unsigned char* var, int size)
{
  int i = 0;
  int j = size - 1;
  char c;

  while (i < j) {
    c = var[i]; var[i] = var[j]; var[j] = c;
    i++, j--;
  }
}